

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemview.cpp
# Opt level: O2

void QAbstractItemView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 uVar2;
  QSize *size;
  DragDropMode *pDVar3;
  bool bVar4;
  undefined1 uVar5;
  DragDropMode DVar6;
  undefined8 *puVar7;
  code *UNRECOVERED_JUMPTABLE;
  InterfaceType *pIVar8;
  void *pvVar9;
  undefined4 uVar10;
  void *pvVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    if (0x10 < (uint)_id) goto switchD_004eacab_caseD_4;
    pDVar3 = (DragDropMode *)*_a;
    switch(_id) {
    case 0:
      uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x418);
      goto LAB_004eb0fa;
    case 1:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x420);
      break;
    case 2:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x3b0);
      break;
    case 3:
      uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x3c8);
      goto LAB_004eb0fa;
    case 4:
      uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x3c9);
      goto LAB_004eb0fa;
    case 5:
      uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x3dc);
      goto LAB_004eb0fa;
    case 6:
      uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x3e4);
      goto LAB_004eb0fa;
    case 7:
      DVar6 = dragDropMode((QAbstractItemView *)_o);
      break;
    case 8:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x3ec);
      break;
    case 9:
      uVar5 = *(undefined1 *)(*(long *)(_o + 8) + 0x42a);
LAB_004eb0fa:
      *(undefined1 *)pDVar3 = uVar5;
      goto switchD_004eacab_caseD_4;
    case 10:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x338);
      break;
    case 0xb:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x33c);
      break;
    case 0xc:
      *(undefined8 *)pDVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0x42c);
      goto switchD_004eacab_caseD_4;
    case 0xd:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x434);
      break;
    case 0xe:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x458);
      break;
    case 0xf:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x45c);
      break;
    case 0x10:
      DVar6 = *(DragDropMode *)(*(long *)(_o + 8) + 0x498);
    }
    *pDVar3 = DVar6;
switchD_004eacab_caseD_4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    goto LAB_004eb4fc;
  case WriteProperty:
    if (0x10 < (uint)_id) goto switchD_004eacab_caseD_4;
    size = (QSize *)*_a;
    switch(_id) {
    case 0:
      *(char *)(*(long *)(_o + 8) + 0x418) = (char)(size->wd).m_i;
      break;
    case 1:
      *(int *)(*(long *)(_o + 8) + 0x420) = (size->wd).m_i;
      break;
    case 2:
      *(int *)(*(long *)(_o + 8) + 0x3b0) = (size->wd).m_i;
      break;
    case 3:
      *(char *)(*(long *)(_o + 8) + 0x3c8) = (char)(size->wd).m_i;
      break;
    case 4:
      *(char *)(*(long *)(_o + 8) + 0x3c9) = (char)(size->wd).m_i;
      break;
    case 5:
      *(char *)(*(long *)(_o + 8) + 0x3dc) = (char)(size->wd).m_i;
      break;
    case 6:
      *(char *)(*(long *)(_o + 8) + 0x3e4) = (char)(size->wd).m_i;
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setDragDropMode((QAbstractItemView *)_o,(size->wd).m_i);
        return;
      }
      goto LAB_004eb4fc;
    case 8:
      *(int *)(*(long *)(_o + 8) + 0x3ec) = (size->wd).m_i;
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setAlternatingRowColors((QAbstractItemView *)_o,SUB41((size->wd).m_i,0));
        return;
      }
      goto LAB_004eb4fc;
    case 10:
      *(int *)(*(long *)(_o + 8) + 0x338) = (size->wd).m_i;
      break;
    case 0xb:
      *(int *)(*(long *)(_o + 8) + 0x33c) = (size->wd).m_i;
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setIconSize((QAbstractItemView *)_o,size);
        return;
      }
      goto LAB_004eb4fc;
    case 0xd:
      *(int *)(*(long *)(_o + 8) + 0x434) = (size->wd).m_i;
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setVerticalScrollMode((QAbstractItemView *)_o,(size->wd).m_i);
        return;
      }
      goto LAB_004eb4fc;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setHorizontalScrollMode((QAbstractItemView *)_o,(size->wd).m_i);
        return;
      }
      goto LAB_004eb4fc;
    case 0x10:
      iVar1 = (size->wd).m_i;
      if (*(int *)(*(long *)(_o + 8) + 0x498) != iVar1) {
        *(int *)(*(long *)(_o + 8) + 0x498) = iVar1;
      }
    }
    goto switchD_004eacab_caseD_4;
  case ResetProperty:
    if (_id == 0xf) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        resetHorizontalScrollMode((QAbstractItemView *)_o);
        return;
      }
      goto LAB_004eb4fc;
    }
    if (_id == 0xe) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        resetVerticalScrollMode((QAbstractItemView *)_o);
        return;
      }
      goto LAB_004eb4fc;
    }
  default:
    goto switchD_004eacab_caseD_4;
  case IndexOfMethod:
    bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                      ((QtMocHelpers *)_a,(void **)pressed,0,0);
    if ((((!bVar4) &&
         (bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                            ((QtMocHelpers *)_a,(void **)clicked,0,1), !bVar4)) &&
        (bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                           ((QtMocHelpers *)_a,(void **)doubleClicked,0,2), !bVar4)) &&
       (((bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                            ((QtMocHelpers *)_a,(void **)activated,0,3), !bVar4 &&
         (bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                            ((QtMocHelpers *)_a,(void **)entered,0,4), !bVar4)) &&
        (bVar4 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)()>
                           ((QtMocHelpers *)_a,(void **)viewportEntered,0,5), !bVar4)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QSize_const&)>
                  ((QtMocHelpers *)_a,(void **)iconSizeChanged,0,6);
        return;
      }
      goto LAB_004eb4fc;
    }
    goto switchD_004eacab_caseD_4;
  case RegisterMethodArgumentMetaType:
    if (_id == 0x11) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] == 2) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
LAB_004eaeca:
        *puVar7 = pIVar8;
        goto switchD_004eacab_caseD_4;
      }
    }
    else if (_id == 0x15) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] < 2) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
        goto LAB_004eaeca;
      }
    }
    else if ((_id == 0x1e) || (_id == 0x1f)) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto LAB_004eaeca;
      }
    }
    else {
      puVar7 = (undefined8 *)*_a;
    }
    *puVar7 = 0;
    goto switchD_004eacab_caseD_4;
  }
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      pressed((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      clicked((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      doubleClicked((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      activated((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      entered((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      viewportEntered((QAbstractItemView *)_o);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iconSizeChanged((QAbstractItemView *)_o,(QSize *)_a[1]);
      return;
    }
    break;
  case 7:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x210);
    goto LAB_004eb49a;
  case 8:
    pvVar11 = _a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x218);
    goto LAB_004eb417;
  case 9:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x220);
    goto LAB_004eb49a;
  case 10:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x228);
    goto LAB_004eb49a;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      edit((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      clearSelection((QAbstractItemView *)_o);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      setCurrentIndex((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      scrollToTop((QAbstractItemView *)_o);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      scrollToBottom((QAbstractItemView *)_o);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      update((QAbstractItemView *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (**(code **)(*(long *)_o + 0x230))(_o,_a[1],_a[2],_a[3]);
      return;
    }
    break;
  case 0x12:
    local_28.d = (Data *)0x0;
    local_28.ptr = (int *)0x0;
    local_28.size = 0;
    (**(code **)(*(long *)_o + 0x230))(_o,_a[1],_a[2],&local_28);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_28);
    goto switchD_004eacab_caseD_4;
  case 0x13:
    pvVar11 = _a[1];
    uVar10 = *_a[2];
    uVar2 = *_a[3];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x238);
    goto LAB_004eb479;
  case 0x14:
    pvVar11 = _a[1];
    uVar10 = *_a[2];
    uVar2 = *_a[3];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x240);
LAB_004eb479:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*UNRECOVERED_JUMPTABLE)(_o,pvVar11,uVar10,uVar2);
      return;
    }
    break;
  case 0x15:
    pvVar11 = _a[1];
    pvVar9 = _a[2];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x248);
    goto LAB_004eb444;
  case 0x16:
    pvVar11 = _a[1];
    pvVar9 = _a[2];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x250);
LAB_004eb444:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*UNRECOVERED_JUMPTABLE)(_o,pvVar11,pvVar9);
      return;
    }
    break;
  case 0x17:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 600);
    goto LAB_004eb49a;
  case 0x18:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x260);
    goto LAB_004eb49a;
  case 0x19:
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x268);
LAB_004eb49a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*UNRECOVERED_JUMPTABLE)();
      return;
    }
    break;
  case 0x1a:
    uVar10 = *_a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x270);
    goto LAB_004eb4e5;
  case 0x1b:
    uVar10 = *_a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x278);
    goto LAB_004eb4e5;
  case 0x1c:
    uVar10 = *_a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x280);
    goto LAB_004eb4e5;
  case 0x1d:
    uVar10 = *_a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x288);
LAB_004eb4e5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*UNRECOVERED_JUMPTABLE)(_o,uVar10);
      return;
    }
    break;
  case 0x1e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (**(code **)(*(long *)_o + 0x290))(_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1f:
    pvVar11 = *_a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x298);
    goto LAB_004eb417;
  case 0x20:
    pvVar11 = *_a[1];
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x2a0);
LAB_004eb417:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      (*UNRECOVERED_JUMPTABLE)(_o,pvVar11);
      return;
    }
    break;
  default:
    goto switchD_004eacab_caseD_4;
  }
LAB_004eb4fc:
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->doubleClicked((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 3: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->entered((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->viewportEntered(); break;
        case 6: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 7: _t->reset(); break;
        case 8: _t->setRootIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->doItemsLayout(); break;
        case 10: _t->selectAll(); break;
        case 11: _t->edit((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 12: _t->clearSelection(); break;
        case 13: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 14: _t->scrollToTop(); break;
        case 15: _t->scrollToBottom(); break;
        case 16: _t->update((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 17: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 18: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 19: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 20: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 21: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 22: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 23: _t->updateEditorData(); break;
        case 24: _t->updateEditorGeometries(); break;
        case 25: _t->updateGeometries(); break;
        case 26: _t->verticalScrollbarAction((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 27: _t->horizontalScrollbarAction((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 28: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 29: _t->horizontalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 30: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 31: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 32: _t->editorDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 30:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::doubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::activated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::entered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)()>(_a, &QAbstractItemView::viewportEntered, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QSize & )>(_a, &QAbstractItemView::iconSizeChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->hasAutoScroll(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->autoScrollMargin(); break;
        case 2: QtMocHelpers::assignFlags<EditTriggers>(_v, _t->editTriggers()); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->tabKeyNavigation(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->showDropIndicator(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->dragDropOverwriteMode(); break;
        case 7: *reinterpret_cast<DragDropMode*>(_v) = _t->dragDropMode(); break;
        case 8: *reinterpret_cast<Qt::DropAction*>(_v) = _t->defaultDropAction(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->alternatingRowColors(); break;
        case 10: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 11: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehavior(); break;
        case 12: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 13: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->textElideMode(); break;
        case 14: *reinterpret_cast<ScrollMode*>(_v) = _t->verticalScrollMode(); break;
        case 15: *reinterpret_cast<ScrollMode*>(_v) = _t->horizontalScrollMode(); break;
        case 16: *reinterpret_cast<int*>(_v) = _t->updateThreshold(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoScroll(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setAutoScrollMargin(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setEditTriggers(*reinterpret_cast<EditTriggers*>(_v)); break;
        case 3: _t->setTabKeyNavigation(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setDropIndicatorShown(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDragDropOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDragDropMode(*reinterpret_cast<DragDropMode*>(_v)); break;
        case 8: _t->setDefaultDropAction(*reinterpret_cast<Qt::DropAction*>(_v)); break;
        case 9: _t->setAlternatingRowColors(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 11: _t->setSelectionBehavior(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 12: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 13: _t->setTextElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 14: _t->setVerticalScrollMode(*reinterpret_cast<ScrollMode*>(_v)); break;
        case 15: _t->setHorizontalScrollMode(*reinterpret_cast<ScrollMode*>(_v)); break;
        case 16: _t->setUpdateThreshold(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 14: _t->resetVerticalScrollMode(); break;
        case 15: _t->resetHorizontalScrollMode(); break;
        default: break;
        }
    }
}